

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_mul_restartable_internal
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  short *tmp;
  mbedtls_ecp_point *Q;
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mbedtls_ecp_point *P_00;
  byte bVar7;
  byte bVar8;
  mbedtls_ecp_point *P_01;
  long lVar9;
  mbedtls_ecp_point *P_02;
  mbedtls_ecp_point *R_00;
  byte bVar10;
  uchar i;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong pos;
  long lStack_180;
  mbedtls_mpi local_178 [9];
  undefined1 local_e8 [8];
  mbedtls_ecp_point Txi;
  mbedtls_mpi M;
  mbedtls_mpi *tmp_00;
  
  lStack_180 = 0x1a0457;
  tmp_00 = (mbedtls_mpi *)f_rng;
  iVar5 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar5 != 0) {
    return iVar5;
  }
  lStack_180 = 0x1a046e;
  iVar5 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  sVar3 = grp->nbits;
  lStack_180 = 0x1a04a9;
  P_00 = (mbedtls_ecp_point *)calloc(2,0x30);
  if (P_00 == (mbedtls_ecp_point *)0x0) {
    iVar5 = -0x4d80;
    goto LAB_001a0732;
  }
  uVar13 = sVar3 + 1;
  uVar14 = uVar13 >> 1;
  for (lVar9 = 0; lVar9 != 0x60; lVar9 = lVar9 + 0x30) {
    lStack_180 = 0x1a04d1;
    mbedtls_ecp_point_init((mbedtls_ecp_point *)((long)&(P_00->X).p + lVar9));
  }
  lStack_180 = 0x1a04e6;
  mpi_init_many(local_178,4);
  lStack_180 = 0x1a04f5;
  iVar5 = mbedtls_ecp_copy(P_00,P);
  if (iVar5 == 0) {
    P_02 = P_00 + 1;
    uVar12 = 0;
    do {
      if (uVar14 == uVar12) {
        lStack_180 = 0x1a0578;
        Txi.Z._8_8_ = P_02;
        iVar5 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&Txi.Z.s,1);
        if (iVar5 == 0) {
          bVar4 = true;
          lStack_180 = 1;
          while (bVar4) {
            Q = P_00 + lStack_180;
            lVar9 = lStack_180 + 1;
            P_01 = P_00 + lStack_180 + -1;
            R_00 = P_00 + lStack_180 * 2 + -1;
            while (lVar9 = lVar9 + -1, lVar9 != 0) {
              tmp_00 = local_178;
              lStack_180 = 0x1a079f;
              iVar5 = ecp_add_mixed(grp,R_00,P_01,Q,tmp_00);
              P_01 = P_01 + -1;
              R_00 = R_00 + -1;
              if (iVar5 != 0) goto LAB_001a0590;
            }
            bVar4 = false;
            lStack_180 = 2;
          }
          lStack_180 = 0x1a0977;
          Txi.Z._8_8_ = P_02;
          iVar5 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&Txi.Z.s,1);
          if (iVar5 == 0) {
            for (lVar9 = 0x20; lVar9 != 0x80; lVar9 = lVar9 + 0x30) {
              lStack_180 = 0x1a099c;
              mbedtls_mpi_free((mbedtls_mpi *)((long)&(P_00->X).p + lVar9));
            }
            iVar5 = 0;
          }
        }
        break;
      }
      if (uVar12 == 0) {
        lStack_180 = 0x1a053d;
        iVar5 = mbedtls_ecp_copy(P_02,P_00);
        if (iVar5 != 0) break;
      }
      lStack_180 = 0x1a0556;
      iVar5 = ecp_double_jac(grp,P_02,P_02,local_178);
      uVar12 = uVar12 + 1;
    } while (iVar5 == 0);
  }
LAB_001a0590:
  lStack_180 = 0x1a059f;
  mpi_free_many(local_178,4);
  if (iVar5 == 0) {
    lStack_180 = 0x1a05b6;
    mbedtls_mpi_init((mbedtls_mpi *)&Txi.Z.s);
    lStack_180 = 0x1a05c2;
    mbedtls_mpi_init((mbedtls_mpi *)local_e8);
    lStack_180 = 0x1a05d4;
    iVar5 = mbedtls_mpi_get_bit(&grp->N,0);
    if (iVar5 == 1) {
      lStack_180 = 0x1a05eb;
      iVar6 = mbedtls_mpi_get_bit(m,0);
      lStack_180 = 0x1a0601;
      iVar5 = mbedtls_mpi_copy((mbedtls_mpi *)&Txi.Z.s,m);
      if (iVar5 == 0) {
        lStack_180 = 0x1a061a;
        iVar5 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_e8,&grp->N,m);
        if (iVar5 == 0) {
          lStack_180 = 0x1a07d0;
          iVar5 = mbedtls_mpi_safe_cond_assign
                            ((mbedtls_mpi *)&Txi.Z.s,(mbedtls_mpi *)local_e8,iVar6 == 0);
          if (iVar5 == 0) {
            lStack_180 = 0x1a082c;
            memset(local_178,0,uVar14 + 1);
            for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
              pos = uVar12;
              for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
                lStack_180 = 0x1a0853;
                iVar5 = mbedtls_mpi_get_bit((mbedtls_mpi *)&Txi.Z.s,pos);
                pbVar1 = (byte *)((long)&local_178[0].p + uVar12);
                *pbVar1 = *pbVar1 | (byte)(iVar5 << ((byte)lVar9 & 0x1f));
                pos = pos + uVar14;
              }
            }
            bVar8 = 0;
            for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
              bVar2 = *(byte *)((long)&local_178[0].p + uVar12);
              bVar10 = *(byte *)((long)&local_178[0].p + uVar12 + 1);
              bVar11 = bVar10 & bVar8;
              tmp_00 = (mbedtls_mpi *)(ulong)bVar11;
              bVar10 = bVar10 ^ bVar8;
              bVar7 = (~bVar10 & 1) * bVar2;
              bVar8 = bVar7 & bVar10 | bVar11;
              *(byte *)((long)&local_178[0].p + uVar12 + 1) = bVar10 ^ bVar7;
              *(byte *)((long)&local_178[0].p + uVar12) = ~bVar10 << 7 | bVar2;
            }
            iVar5 = 0;
          }
        }
      }
      lStack_180 = 0x1a0639;
      mbedtls_mpi_free((mbedtls_mpi *)local_e8);
      lStack_180 = 0x1a0645;
      mbedtls_mpi_free((mbedtls_mpi *)&Txi.Z.s);
      if (iVar5 == 0) {
        lStack_180 = 0x1a065c;
        mbedtls_ecp_point_init((mbedtls_ecp_point *)local_e8);
        lStack_180 = 0x1a066b;
        mpi_init_many((mbedtls_mpi *)&Txi.Z.s,4);
        lStack_180 = 0x1a0682;
        iVar5 = ecp_select_comb(grp,R,P_00,*(uchar *)((long)&local_178[0].p + uVar14),(uchar)tmp_00)
        ;
        if (iVar5 == 0) {
          if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
            iVar5 = 0;
            if (1 < uVar13) goto LAB_001a0882;
          }
          else {
            lStack_180 = 0x1a0800;
            iVar5 = ecp_randomize_jac(grp,R,f_rng,p_rng);
            if (1 < uVar13 && iVar5 == 0) {
LAB_001a0882:
              tmp = &Txi.Z.s;
              while( true ) {
                uVar13 = uVar14 - 1;
                i = (uchar)tmp_00;
                lStack_180 = 0x1a08a9;
                iVar5 = ecp_double_jac(grp,R,R,(mbedtls_mpi *)tmp);
                if (iVar5 != 0) break;
                lStack_180 = 0x1a08c8;
                iVar5 = ecp_select_comb(grp,(mbedtls_ecp_point *)local_e8,P_00,
                                        *(uchar *)((long)local_178 + (uVar14 - 1)),i);
                if (iVar5 != 0) break;
                lStack_180 = 0x1a08e5;
                tmp_00 = (mbedtls_mpi *)tmp;
                iVar5 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)local_e8,(mbedtls_mpi *)tmp);
                if ((iVar5 != 0) || (uVar14 = uVar13, uVar13 == 0)) break;
              }
            }
          }
        }
        lStack_180 = 0x1a0699;
        mbedtls_ecp_point_free((mbedtls_ecp_point *)local_e8);
        lStack_180 = 0x1a06a8;
        mpi_free_many((mbedtls_mpi *)&Txi.Z.s,4);
        if (iVar5 == 0) {
          lStack_180 = 0x1a06c5;
          iVar5 = ecp_safe_invert_jac(grp,R,iVar6 == 0);
          if (iVar5 == 0) {
            if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
              lStack_180 = 0x1a06e1;
              iVar5 = ecp_randomize_jac(grp,R,f_rng,p_rng);
              if (iVar5 != 0) goto LAB_001a06ff;
            }
            lStack_180 = 0x1a06f0;
            iVar5 = ecp_normalize_jac(grp,R);
          }
        }
      }
    }
    else {
      iVar5 = -0x4f80;
    }
  }
LAB_001a06ff:
  if (P_00 != grp->T) {
    for (lVar9 = 0; lVar9 != 0x60; lVar9 = lVar9 + 0x30) {
      lStack_180 = 0x1a071d;
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).p + lVar9));
    }
    lStack_180 = 0x1a072b;
    free(P_00);
  }
  if (iVar5 == 0) {
    return 0;
  }
LAB_001a0732:
  lStack_180 = 0x1a073d;
  mbedtls_ecp_point_free(R);
  return iVar5;
}

Assistant:

static int ecp_mul_restartable_internal(mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                                        const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                                        int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
                                        mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if (rs_ctx != NULL && rs_ctx->depth++ == 0) {
        rs_ctx->ops_done = 0;
    }
#else
    (void) rs_ctx;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ((is_grp_capable = mbedtls_internal_ecp_grp_capable(grp))) {
        MBEDTLS_MPI_CHK(mbedtls_internal_ecp_init(grp));
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

    int restarting = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restarting = (rs_ctx != NULL && rs_ctx->rsm != NULL);
#endif
    /* skip argument check when restarting */
    if (!restarting) {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET(MBEDTLS_ECP_OPS_CHK);

        /* Common sanity checks */
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_privkey(grp, m));
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        MBEDTLS_MPI_CHK(ecp_mul_mxz(grp, R, m, P, f_rng, p_rng));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        MBEDTLS_MPI_CHK(ecp_mul_comb(grp, R, m, P, f_rng, p_rng, rs_ctx));
    }
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if (is_grp_capable) {
        mbedtls_internal_ecp_free(grp);
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL) {
        rs_ctx->depth--;
    }
#endif

    return ret;
}